

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_Logistic_Test::TestBody(Sampling_Logistic_Test *this)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [12];
  float *pfVar11;
  size_t sVar12;
  bool bVar13;
  uint uVar14;
  Allocator AVar15;
  byte bVar16;
  int iVar17;
  char *pcVar18;
  char *in_R9;
  uint64_t oldstate;
  undefined1 *puVar19;
  long lVar20;
  undefined1 auVar21 [16];
  float fVar22;
  Float FVar23;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar28 [64];
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  span<const_float> f;
  Float b;
  Float a;
  Float s;
  AssertionResult gtest_ar_;
  Float dp;
  AssertionResult gtest_ar;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> values;
  PiecewiseConstant1D distrib;
  AssertHelper local_1d0;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  long *local_1b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_1a8 [8];
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined8 local_198;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  float local_15c;
  undefined1 local_158 [16];
  string local_140;
  float local_11c;
  undefined1 local_118 [16];
  _Any_data local_108;
  code *pcStack_f8;
  code *pcStack_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d0;
  long local_c8;
  AssertHelper local_c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_b8;
  float local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  PiecewiseConstant1D local_80;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  lVar20 = 0;
  local_d0 = &DAT_5851f42d4c957f2e;
  do {
    local_1bc = *(float *)((long)&DAT_00572950 + lVar20);
    local_1c0 = *(float *)((long)&DAT_00572954 + lVar20);
    local_198 = (undefined1 *)CONCAT44(local_198._4_4_,local_1c0);
    local_1c4 = *(float *)((long)&DAT_00572958 + lVar20);
    local_188._0_4_ = local_1c4;
    local_108._M_unused._M_object = (void *)0x0;
    local_108._8_8_ = 0;
    pcStack_f8 = (code *)0x0;
    pcStack_f0 = (code *)0x0;
    local_108._M_unused._M_object = operator_new(0x18);
    *(float **)local_108._M_unused._0_8_ = &local_1bc;
    *(float **)((long)local_108._M_unused._0_8_ + 8) = &local_1c0;
    *(float **)((long)local_108._M_unused._0_8_ + 0x10) = &local_1c4;
    pcStack_f0 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:814:25)>
                 ::_M_invoke;
    pcStack_f8 = std::
                 _Function_handler<float_(float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp:814:25)>
                 ::_M_manager;
    AVar15.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Sample1DFunction
              (&local_b8,(function<float_(float)> *)&local_108,0x2000,0x10,(Float)local_198,
               (Float)local_188._0_4_,AVar15);
    local_c8 = lVar20;
    if (pcStack_f8 != (code *)0x0) {
      (*pcStack_f8)(&local_108,&local_108,__destroy_functor);
    }
    sVar12 = local_b8.nStored;
    pfVar11 = local_b8.ptr;
    local_198 = (undefined1 *)CONCAT44(local_198._4_4_,local_1c0);
    local_188._0_4_ = local_1c4;
    AVar15.memoryResource = pstd::pmr::new_delete_resource();
    f.n = sVar12;
    f.ptr = pfVar11;
    pbrt::PiecewiseConstant1D::PiecewiseConstant1D
              (&local_80,f,(Float)local_198,(Float)local_188._0_4_,AVar15);
    iVar17 = 100;
    puVar19 = local_d0;
    do {
      uVar14 = (uint)((ulong)puVar19 >> 0x2d) ^ (uint)((ulong)puVar19 >> 0x1b);
      bVar16 = (byte)((ulong)puVar19 >> 0x3b);
      auVar21._8_8_ = in_XMM6_Qb;
      auVar21._0_8_ = in_XMM6_Qa;
      auVar21 = vcvtusi2ss_avx512f(auVar21,uVar14 >> bVar16 | uVar14 << 0x20 - bVar16);
      local_11c = auVar21._0_4_ * 2.3283064e-10;
      auVar21 = vminss_avx(ZEXT416((uint)local_11c),ZEXT416(0x3f7fffff));
      local_198 = (undefined1 *)CONCAT44(local_198._4_4_,auVar21._0_4_);
      _local_1a8 = ZEXT416((uint)local_1bc);
      local_158 = ZEXT416((uint)local_1c0);
      local_188 = ZEXT416((uint)local_1c4);
      fVar22 = expf(-local_1c0 / local_1bc);
      local_178._0_4_ = 1.0 / (fVar22 + 1.0);
      fVar22 = expf(-(float)local_188._0_4_ / (float)local_1a8._0_4_);
      auVar21 = vfmadd231ss_fma(ZEXT416((uint)((Float)local_198 * (1.0 / (fVar22 + 1.0)))),
                                ZEXT416((uint)(1.0 - (Float)local_198)),
                                ZEXT416((uint)local_178._0_4_));
      auVar1._8_4_ = 0x80000000;
      auVar1._0_8_ = 0x8000000080000000;
      auVar1._12_4_ = 0x80000000;
      _local_1a8 = vxorps_avx512vl(_local_1a8,auVar1);
      fVar22 = logf(1.0 / auVar21._0_4_ + -1.0);
      auVar21 = vminss_avx(local_188,ZEXT416((uint)(fVar22 * (float)local_1a8._0_4_)));
      uVar2 = vcmpss_avx512f(ZEXT416((uint)(fVar22 * (float)local_1a8._0_4_)),local_158,1);
      bVar13 = (bool)((byte)uVar2 & 1);
      local_188._4_12_ = auVar21._4_12_;
      local_188._0_4_ = (uint)bVar13 * local_158._0_4_ + (uint)!bVar13 * auVar21._0_4_;
      auVar10 = stack0xfffffffffffffe5c;
      auVar9._12_4_ = 0;
      auVar9._0_12_ = stack0xfffffffffffffe5c;
      _local_1a8 = auVar9 << 0x20;
      if ((local_1c0 <= (float)local_188._0_4_) && ((float)local_188._0_4_ <= local_1c4)) {
        local_1a8._0_4_ = local_1bc;
        local_e8 = ZEXT416((uint)local_1c4);
        auVar24._8_4_ = 0x80000000;
        auVar24._0_8_ = 0x8000000080000000;
        auVar24._12_4_ = 0x80000000;
        auVar21 = vorps_avx(auVar24,local_188);
        fVar22 = auVar21._0_4_ / local_1bc;
        local_118._0_4_ = fVar22;
        local_158 = ZEXT416((uint)local_1c0);
        unique0x10000fa5 = auVar10;
        local_178._0_4_ = expf(fVar22);
        local_178._4_4_ = extraout_XMM0_Db;
        local_178._8_4_ = extraout_XMM0_Dc;
        local_178._12_4_ = extraout_XMM0_Dd;
        fVar22 = expf((float)local_118._0_4_);
        local_118 = ZEXT416((uint)((float)local_1a8._0_4_ * (fVar22 + 1.0) * (fVar22 + 1.0)));
        auVar3._8_4_ = 0x80000000;
        auVar3._0_8_ = 0x8000000080000000;
        auVar3._12_4_ = 0x80000000;
        auVar21 = vxorps_avx512vl(local_e8,auVar3);
        fVar22 = expf(auVar21._0_4_ / (float)local_1a8._0_4_);
        auVar1 = vinsertps_avx(local_118,ZEXT416((uint)(fVar22 + 1.0)),0x10);
        auVar21 = vblendps_avx(local_178,_DAT_0056a7d0,0xe);
        local_178 = vdivps_avx(auVar21,auVar1);
        auVar4._8_4_ = 0x80000000;
        auVar4._0_8_ = 0x8000000080000000;
        auVar4._12_4_ = 0x80000000;
        auVar21 = vxorps_avx512vl(local_158,auVar4);
        fVar22 = expf(auVar21._0_4_ / (float)local_1a8._0_4_);
        auVar21 = vmovshdup_avx(local_178);
        local_1a8._0_4_ = local_178._0_4_ / (auVar21._0_4_ - 1.0 / (fVar22 + 1.0));
      }
      FVar23 = pbrt::PiecewiseConstant1D::Sample(&local_80,(Float)local_198,&local_15c,(int *)0x0);
      local_158._0_4_ = FVar23;
      auVar5._8_4_ = 0x7fffffff;
      auVar5._0_8_ = 0x7fffffff7fffffff;
      auVar5._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl(ZEXT416((uint)((float)local_188._0_4_ - FVar23)),auVar5);
      local_1d0.data_._0_4_ = auVar21._0_4_;
      local_1b8 = (long *)&DAT_3f689374bc6a7efa;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_140,"std::abs(cx - dx)","3e-3",(float *)&local_1d0,
                 (double *)&local_1b8);
      if ((char)local_140._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 2),"Closed form = ",0xe);
        std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 2),", distrib = ",0xc);
        std::ostream::_M_insert<double>((double)(float)local_158._0_4_);
        pcVar18 = "";
        if ((undefined8 *)local_140._M_string_length != (undefined8 *)0x0) {
          pcVar18 = *(char **)local_140._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x338,pcVar18);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_1b8 != (long *)0x0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (local_1b8 != (long *)0x0)) {
            (**(code **)(*local_1b8 + 8))();
          }
          local_1b8 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_140._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      auVar6._8_4_ = 0x7fffffff;
      auVar6._0_8_ = 0x7fffffff7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx512vl(ZEXT416((uint)((float)local_1a8._0_4_ - local_15c)),auVar6);
      local_1d0.data_._0_4_ = auVar21._0_4_;
      local_1b8 = (long *)&DAT_3f689374bc6a7efa;
      testing::internal::CmpHelperLT<float,double>
                ((internal *)&local_140,"std::abs(cp - dp)","3e-3",(float *)&local_1d0,
                 (double *)&local_1b8);
      if ((char)local_140._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 2),"Closed form PDF = ",0x12);
        std::ostream::_M_insert<double>((double)(float)local_1a8._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b8 + 2),", distrib PDF = ",0x10);
        std::ostream::_M_insert<double>((double)local_15c);
        pcVar18 = "";
        if ((undefined8 *)local_140._M_string_length != (undefined8 *)0x0) {
          pcVar18 = *(char **)local_140._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x33a,pcVar18);
        testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1b8);
        testing::internal::AssertHelper::~AssertHelper(&local_1d0);
        if (local_1b8 != (long *)0x0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (local_1b8 != (long *)0x0)) {
            (**(code **)(*local_1b8 + 8))();
          }
          local_1b8 = (long *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_140._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_1a8._0_4_ = local_1bc;
      local_98 = -(float)local_188._0_4_;
      uStack_94 = local_188._4_4_ ^ 0x80000000;
      uStack_90 = local_188._8_4_ ^ 0x80000000;
      uStack_8c = local_188._12_4_ ^ 0x80000000;
      local_178 = ZEXT416((uint)local_1c0);
      local_e8 = ZEXT416((uint)local_1c4);
      local_158._0_4_ = expf(-(float)local_188._0_4_ / local_1bc);
      local_158._4_4_ = extraout_XMM0_Db_00;
      local_158._8_4_ = extraout_XMM0_Dc_00;
      local_158._12_4_ = extraout_XMM0_Dd_00;
      auVar7._8_4_ = 0x80000000;
      auVar7._0_8_ = 0x8000000080000000;
      auVar7._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(local_178,auVar7);
      fVar22 = auVar21._0_4_ / (float)local_1a8._0_4_;
      local_118._0_4_ = fVar22;
      local_178._0_4_ = expf(fVar22);
      local_178._4_4_ = extraout_XMM0_Db_01;
      local_178._8_4_ = extraout_XMM0_Dc_01;
      local_178._12_4_ = extraout_XMM0_Dd_01;
      auVar8._8_4_ = 0x80000000;
      auVar8._0_8_ = 0x8000000080000000;
      auVar8._12_4_ = 0x80000000;
      auVar21 = vxorps_avx512vl(local_e8,auVar8);
      local_1a8._0_4_ = expf(auVar21._0_4_ / (float)local_1a8._0_4_);
      local_1a8._4_4_ = extraout_XMM0_Db_02;
      uStack_1a0 = extraout_XMM0_Dc_02;
      uStack_19c = extraout_XMM0_Dd_02;
      auVar28._0_4_ = expf((float)local_118._0_4_);
      auVar28._4_60_ = extraout_var;
      auVar21 = vinsertps_avx(local_158,ZEXT416((uint)local_1a8._0_4_),0x10);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar30._0_4_ = auVar21._0_4_ + 1.0;
      auVar30._4_4_ = auVar21._4_4_ + 1.0;
      auVar30._8_4_ = auVar21._8_4_ + 1.0;
      auVar30._12_4_ = auVar21._12_4_ + 1.0;
      auVar21 = vdivps_avx(auVar32,auVar30);
      auVar1 = vinsertps_avx(local_178,auVar28._0_16_,0x10);
      auVar25._0_4_ = auVar1._0_4_ + 1.0;
      auVar25._4_4_ = auVar1._4_4_ + 1.0;
      auVar25._8_4_ = auVar1._8_4_ + 1.0;
      auVar25._12_4_ = auVar1._12_4_ + 1.0;
      auVar1 = vdivps_avx(auVar32,auVar25);
      auVar1 = vsubps_avx(auVar21,auVar1);
      auVar21 = vmovshdup_avx(auVar1);
      auVar26._0_4_ = auVar1._0_4_ / auVar21._0_4_;
      auVar26._4_12_ = auVar1._4_12_;
      auVar1 = vminss_avx(ZEXT416((uint)local_11c),ZEXT416(0x3f7fffff));
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar21 = vandps_avx(auVar26,auVar34);
      auVar21 = vminss_avx(auVar21,auVar1);
      bVar13 = auVar21._0_4_ < 0.01;
      fVar22 = (Float)local_198 - auVar26._0_4_;
      auVar21 = vandps_avx(ZEXT416((uint)bVar13 * (int)fVar22 +
                                   (uint)!bVar13 *
                                   (int)((fVar22 + fVar22) / ((Float)local_198 + auVar26._0_4_))),
                           auVar34);
      local_1b8 = (long *)CONCAT71(local_1b8._1_7_,auVar21._0_4_ <= 0.01);
      local_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (0.01 < auVar21._0_4_) {
        testing::Message::Message((Message *)&local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1d0.data_)->line,"u = ",4);
        std::ostream::_M_insert<double>((double)(Float)local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1d0.data_)->line," -> x = ",8);
        std::ostream::_M_insert<double>((double)(float)local_188._0_4_);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&(local_1d0.data_)->line," -> ... ",8);
        local_198 = (undefined1 *)CONCAT44(local_198._4_4_,local_1bc);
        _local_1a8 = ZEXT416((uint)local_1c0);
        local_158 = ZEXT416((uint)local_1c4);
        local_188._0_4_ = expf(local_98 / local_1bc);
        local_188._4_4_ = extraout_XMM0_Db_03;
        local_188._8_4_ = extraout_XMM0_Dc_03;
        local_188._12_4_ = extraout_XMM0_Dd_03;
        local_178._0_4_ = -(float)local_1a8._0_4_ / (Float)local_198;
        local_1a8._0_4_ = expf(-(float)local_1a8._0_4_ / (Float)local_198);
        local_1a8._4_4_ = extraout_XMM0_Db_04;
        uStack_1a0 = extraout_XMM0_Dc_04;
        uStack_19c = extraout_XMM0_Dd_04;
        fVar22 = expf(-(float)local_158._0_4_ / (Float)local_198);
        local_198 = (undefined1 *)CONCAT44(extraout_XMM0_Db_05,fVar22);
        auVar29._0_4_ = expf((float)local_178._0_4_);
        auVar29._4_60_ = extraout_var_00;
        auVar21 = vinsertps_avx(local_188,ZEXT416((uint)(Float)local_198),0x10);
        auVar33._8_4_ = 0x3f800000;
        auVar33._0_8_ = 0x3f8000003f800000;
        auVar33._12_4_ = 0x3f800000;
        auVar31._0_4_ = auVar21._0_4_ + 1.0;
        auVar31._4_4_ = auVar21._4_4_ + 1.0;
        auVar31._8_4_ = auVar21._8_4_ + 1.0;
        auVar31._12_4_ = auVar21._12_4_ + 1.0;
        auVar21 = vdivps_avx(auVar33,auVar31);
        auVar1 = vinsertps_avx(_local_1a8,auVar29._0_16_,0x10);
        auVar27._0_4_ = auVar1._0_4_ + 1.0;
        auVar27._4_4_ = auVar1._4_4_ + 1.0;
        auVar27._8_4_ = auVar1._8_4_ + 1.0;
        auVar27._12_4_ = auVar1._12_4_ + 1.0;
        auVar1 = vdivps_avx(auVar33,auVar27);
        auVar1 = vsubps_avx(auVar21,auVar1);
        auVar21 = vmovshdup_avx(auVar1);
        std::ostream::_M_insert<double>((double)(auVar1._0_4_ / auVar21._0_4_));
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_140,(internal *)&local_1b8,
                   (AssertionResult *)"checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b))","true"
                   ,"false",in_R9);
        local_198 = puVar19;
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x345,(char *)CONCAT71(local_140._M_dataplus._M_p._1_7_,
                                           (char)local_140._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_140._M_dataplus._M_p._1_7_,(char)local_140._M_dataplus._M_p) !=
            &local_140.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_140._M_dataplus._M_p._1_7_,(char)local_140._M_dataplus._M_p
                                  ),local_140.field_2._M_allocated_capacity + 1);
        }
        puVar19 = local_198;
        if (local_1d0.data_ != (AssertHelperData *)0x0) {
          bVar13 = testing::internal::IsTrue(true);
          if ((bVar13) && (local_1d0.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_1d0.data_ + 8))();
          }
          local_1d0.data_ = (AssertHelperData *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      puVar19 = (undefined1 *)((long)puVar19 * 0x5851f42d4c957f2d + 1);
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_80.cdf);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_80.func);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_b8);
    lVar20 = local_c8 + 0xc;
  } while (lVar20 != 0x24);
  return;
}

Assistant:

TEST(Sampling, Logistic) {
    Float params[][3] = {{1., -Pi, Pi}, {5, 0, 3}, {.25, -5, -3}};
    for (const auto p : params) {
        Float s = p[0], a = p[1], b = p[2];
        auto logistic = [&](Float v) { return TrimmedLogistic(v, s, a, b); };

        auto values = Sample1DFunction(logistic, 8192, 16, a, b);
        PiecewiseConstant1D distrib(values, a, b);
        for (Float u : Uniform1D(100)) {
            Float cx = SampleTrimmedLogistic(u, s, a, b);
            Float cp = TrimmedLogisticPDF(cx, s, a, b);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(cx - dx), 3e-3)
                << "Closed form = " << cx << ", distrib = " << dx;
            EXPECT_LT(std::abs(cp - dp), 3e-3)
                << "Closed form PDF = " << cp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTrimmedLogisticSample(cx, s, a, b)))
                << "u = " << u << " -> x = " << cx << " -> ... "
                << InvertTrimmedLogisticSample(cx, s, a, b);
        }
    }
}